

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int MD5_Update(MD5_CTX *c,void *data,size_t len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  void *pvVar9;
  uint uVar10;
  uint *__dest;
  ulong __n;
  
  uVar8 = c->Nl;
  uVar10 = (int)len * 8;
  c->Nl = uVar10 + uVar8;
  c->Nh = c->Nh + ((uint)(len >> 0x1d) & 7) + (uint)CARRY4(uVar10,uVar8);
  uVar8 = uVar8 >> 3 & 0x3f;
  if (uVar8 != 0) {
    __dest = (uint *)((long)c->data + (ulong)uVar8);
    __n = (ulong)(0x40 - uVar8);
    if (len < __n) goto LAB_0010714a;
    memcpy(__dest,data,__n);
    MD5Transform(&c->A,c->data);
    data = (void *)((long)data + __n);
    len = len - __n;
  }
  if (0x3f < len) {
    do {
      uVar1 = *data;
      uVar2 = *(undefined8 *)((long)data + 8);
      uVar3 = *(undefined8 *)((long)data + 0x10);
      uVar4 = *(undefined8 *)((long)data + 0x18);
      uVar5 = *(undefined8 *)((long)data + 0x20);
      uVar6 = *(undefined8 *)((long)data + 0x28);
      uVar7 = *(undefined8 *)((long)data + 0x38);
      *(undefined8 *)(c->data + 0xc) = *(undefined8 *)((long)data + 0x30);
      *(undefined8 *)(c->data + 0xe) = uVar7;
      *(undefined8 *)(c->data + 8) = uVar5;
      *(undefined8 *)(c->data + 10) = uVar6;
      *(undefined8 *)(c->data + 4) = uVar3;
      *(undefined8 *)(c->data + 6) = uVar4;
      *(undefined8 *)c->data = uVar1;
      *(undefined8 *)(c->data + 2) = uVar2;
      MD5Transform(&c->A,c->data);
      data = (void *)((long)data + 0x40);
      len = len - 0x40;
    } while (0x3f < len);
  }
  __dest = c->data;
LAB_0010714a:
  pvVar9 = memcpy(__dest,data,len);
  return (int)pvVar9;
}

Assistant:

void MD5_Update(MD5_CTX *ctx, const unsigned char *buf, size_t len) {
    uint32_t t;

    t = ctx->bits[0];
    if ((ctx->bits[0] = t + ((uint32_t) len << 3)) < t) ctx->bits[1]++;
    ctx->bits[1] += (uint32_t) len >> 29;

    t = (t >> 3) & 0x3f;

    if (t) {
        unsigned char *p = (unsigned char *) ctx->in + t;

        t = 64 - t;
        if (len < t) {
            memcpy(p, buf, len);
            return;
        }
        memcpy(p, buf, t);
        byteReverse(ctx->in, 16);
        MD5Transform(ctx->buf, (uint32_t *) ctx->in);
        buf += t;
        len -= t;
    }

    while (len >= 64) {
        memcpy(ctx->in, buf, 64);
        byteReverse(ctx->in, 16);
        MD5Transform(ctx->buf, (uint32_t *) ctx->in);
        buf += 64;
        len -= 64;
    }

    memcpy(ctx->in, buf, len);
}